

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanPlayerStrategy.cpp
# Opt level: O0

void __thiscall HumanPlayerStrategy::execute(HumanPlayerStrategy *this,Game *game,Player *player)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  Map *pMVar5;
  string local_d0;
  undefined1 local_b0 [8];
  string choice_1;
  string local_70;
  undefined1 local_40 [8];
  string choice;
  Player *player_local;
  Game *game_local;
  HumanPlayerStrategy *this_local;
  
  choice.field_2._8_8_ = player;
  Player::rollDice(player);
  Game::resolvePlayer(game,(Player *)choice.field_2._8_8_,true);
  iVar2 = Player::getLifePoints((Player *)choice.field_2._8_8_);
  if (iVar2 < 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar4 = Player::getPlayerName_abi_cxx11_((Player *)choice.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3," died while resolving dice");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    iVar2 = Player::getZone((Player *)choice.field_2._8_8_);
    if ((iVar2 < 1) || (iVar2 = Player::getZone((Player *)choice.field_2._8_8_), 6 < iVar2)) {
      pMVar5 = Game::getGameMap(game);
      bVar1 = Map::isManhattanEmpty(pMVar5);
      if (bVar1) {
        Player::setPhase((Player *)choice.field_2._8_8_,Move);
        iVar2 = Game::getNumberOfPlayers(game);
        if (iVar2 < 5) {
          Player::setZone((Player *)choice.field_2._8_8_,1);
          pMVar5 = Game::getGameMap(game);
          Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
          pMVar5 = Game::getGameMap(game);
          Map::setRegionOwner(pMVar5,1,(Player *)choice.field_2._8_8_);
          poVar3 = std::operator<<((ostream *)&std::cout,"Player : ");
          psVar4 = Player::getPlayerName_abi_cxx11_((Player *)choice.field_2._8_8_);
          poVar3 = std::operator<<(poVar3,(string *)psVar4);
          poVar3 = std::operator<<(poVar3," is in : ");
          Player::getZoneName_abi_cxx11_(&local_70,(Player *)choice.field_2._8_8_);
          poVar3 = std::operator<<(poVar3,(string *)&local_70);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_70);
        }
        else {
          Player::setZone((Player *)choice.field_2._8_8_,4);
          pMVar5 = Game::getGameMap(game);
          Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
          pMVar5 = Game::getGameMap(game);
          Map::setRegionOwner(pMVar5,4,(Player *)choice.field_2._8_8_);
          poVar3 = std::operator<<((ostream *)&std::cout,"Player : ");
          psVar4 = Player::getPlayerName_abi_cxx11_((Player *)choice.field_2._8_8_);
          poVar3 = std::operator<<(poVar3,(string *)psVar4);
          poVar3 = std::operator<<(poVar3," is in : ");
          Player::getZoneName_abi_cxx11_
                    ((string *)(choice_1.field_2._M_local_buf + 8),(Player *)choice.field_2._8_8_);
          poVar3 = std::operator<<(poVar3,(string *)(choice_1.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)(choice_1.field_2._M_local_buf + 8));
        }
      }
      else {
        std::__cxx11::string::string((string *)local_b0);
        poVar3 = std::operator<<((ostream *)&std::cout,"There is another player in Manhattan");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Do you want to move (M) or stay (S) in current location : ");
        Player::getZoneName_abi_cxx11_(&local_d0,(Player *)choice.field_2._8_8_);
        poVar3 = std::operator<<(poVar3,(string *)&local_d0);
        poVar3 = std::operator<<(poVar3,"?");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_d0);
        std::operator>>((istream *)&std::cin,(string *)local_b0);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0,"M");
        if (bVar1) {
          pMVar5 = Game::getGameMap(game);
          Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
          pMVar5 = Game::getGameMap(game);
          Map::move(pMVar5,(Player *)choice.field_2._8_8_);
        }
        std::__cxx11::string::~string((string *)local_b0);
      }
    }
    else {
      Player::setPhase((Player *)choice.field_2._8_8_,Move);
      std::__cxx11::string::string((string *)local_40);
      iVar2 = Player::getZone((Player *)choice.field_2._8_8_);
      if (iVar2 == 1) {
        Player::setZone((Player *)choice.field_2._8_8_,2);
        pMVar5 = Game::getGameMap(game);
        Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
        pMVar5 = Game::getGameMap(game);
        Map::setRegionOwner(pMVar5,2,(Player *)choice.field_2._8_8_);
      }
      else {
        iVar2 = Player::getZone((Player *)choice.field_2._8_8_);
        if (iVar2 == 2) {
          Player::setZone((Player *)choice.field_2._8_8_,3);
          pMVar5 = Game::getGameMap(game);
          Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
          pMVar5 = Game::getGameMap(game);
          Map::setRegionOwner(pMVar5,3,(Player *)choice.field_2._8_8_);
        }
        else {
          iVar2 = Player::getZone((Player *)choice.field_2._8_8_);
          if (iVar2 == 3) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "You are in Upper Manhattan. Do you wish to stay? (Y | N) ");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::operator>>((istream *)&std::cin,(string *)local_40);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"N");
            if (bVar1) {
              pMVar5 = Game::getGameMap(game);
              Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
              pMVar5 = Game::getGameMap(game);
              Map::move(pMVar5,(Player *)choice.field_2._8_8_);
            }
          }
          else {
            iVar2 = Player::getZone((Player *)choice.field_2._8_8_);
            if (iVar2 == 4) {
              Player::setZone((Player *)choice.field_2._8_8_,5);
              pMVar5 = Game::getGameMap(game);
              Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
              pMVar5 = Game::getGameMap(game);
              Map::setRegionOwner(pMVar5,5,(Player *)choice.field_2._8_8_);
            }
            else {
              iVar2 = Player::getZone((Player *)choice.field_2._8_8_);
              if (iVar2 == 5) {
                Player::setZone((Player *)choice.field_2._8_8_,6);
                pMVar5 = Game::getGameMap(game);
                Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
                pMVar5 = Game::getGameMap(game);
                Map::setRegionOwner(pMVar5,6,(Player *)choice.field_2._8_8_);
              }
              else {
                iVar2 = Player::getZone((Player *)choice.field_2._8_8_);
                if (iVar2 == 6) {
                  poVar3 = std::operator<<((ostream *)&std::cout,
                                           "You are in Upper Manhattan. Do you wish to stay? (Y | N) "
                                          );
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  std::operator>>((istream *)&std::cin,(string *)local_40);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_40,"N");
                  if (bVar1) {
                    pMVar5 = Game::getGameMap(game);
                    Map::removeRegionOwner(pMVar5,(Player *)choice.field_2._8_8_);
                    pMVar5 = Game::getGameMap(game);
                    Map::move(pMVar5,(Player *)choice.field_2._8_8_);
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_40);
    }
    Game::buyCards(game,(Player *)choice.field_2._8_8_);
  }
  return;
}

Assistant:

void HumanPlayerStrategy::execute(Game *game, Player *player)
{

    player->rollDice();
    // resolve the dice (mandatory) ordered
    game->resolvePlayer(player, true);

    if(player->getLifePoints() <= 0) {
        cout << "Player : " << player->getPlayerName() << " died while resolving dice" << endl;
        return;
    }
    // move

    // if player is in manhattan
    if(player->getZone()>0 && player->getZone()<7){
        player->setPhase(Player::Phase::Move);
        std::string choice;
        if(player->getZone() == 1) {  // Manhattan Lower 2-4
            player->setZone(2);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(2, player);
        }
        else if(player->getZone() == 2) {  // Manhattan Midtown 2-4
            player->setZone(3);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(3, player);
        }
        else if(player->getZone() == 3) {  // Manhattan Upper 2-4
            cout << "You are in Upper Manhattan. Do you wish to stay? (Y | N) " << endl;
            cin >> choice;
            if (choice == "N"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }
        }
        else if(player->getZone() == 4) {  // Manhattan Lower 5-6
            player->setZone(5);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(5, player);
        }
        else if(player->getZone() == 5) {  // Manhattan Midtown 5-6
            player->setZone(6);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(6, player);
        }
        else if(player->getZone() == 6) {  // Manhattan Upper 5-6
            cout << "You are in Upper Manhattan. Do you wish to stay? (Y | N) " << endl;
            cin >> choice;
            if (choice == "N"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }
        }


    }
    else { // Not in manhattan
        if(game->getGameMap()->isManhattanEmpty()){ // must move to manhattan if empty
            player->setPhase(Player::Phase::Move);
            if (game->getNumberOfPlayers() < 5){
                player->setZone(1);
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->setRegionOwner(1, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
            else{
                player->setZone(4);
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->setRegionOwner(4, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
        }
        else{ // there is atleast 1 player in manhattan
            std::string choice;
            cout << "There is another player in Manhattan" << endl;
            cout << "Do you want to move (M) or stay (S) in current location : " << player->getZoneName() << "?" << endl;
            cin >> choice;
            if (choice == "M"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }

        }

    }

    // buy cards (optional)
    game->buyCards(player);
}